

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O1

void Fra_CnfNodeAddToSolver(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pNode;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *vFrontier;
  void **ppvVar5;
  Vec_Ptr_t *vSuper;
  long lVar6;
  void *pvVar7;
  long lVar8;
  
  if (pOld == (Aig_Obj_t *)0x0 && pNew == (Aig_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0xf3,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((pOld == (Aig_Obj_t *)0x0) ||
      (*(long *)(*(long *)((long)(pOld->field_5).pData + 0x90) + (long)pOld->Id * 8) != 0)) &&
     ((pNew == (Aig_Obj_t *)0x0 ||
      (*(long *)(*(long *)((long)(pNew->field_5).pData + 0x90) + (long)pNew->Id * 8) != 0)))) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vFrontier->pArray = ppvVar5;
  if (pOld != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pNew,vFrontier);
  }
  if (0 < vFrontier->nSize) {
    lVar8 = 0;
    do {
      pNode = (Aig_Obj_t *)vFrontier->pArray[lVar8];
      if (*(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) == 0) {
        __assert_fail("Fra_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0xff,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (*(long *)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) != 0) {
        __assert_fail("Fra_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x100,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      iVar4 = Aig_ObjIsMuxType(pNode);
      if (iVar4 == 0) {
        vSuper = Fra_CollectSuper(pNode,1);
        if (0 < vSuper->nSize) {
          lVar6 = 0;
          do {
            Fra_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)vSuper->pArray[lVar6] & 0xfffffffffffffffe),vFrontier)
            ;
            lVar6 = lVar6 + 1;
          } while (lVar6 < vSuper->nSize);
        }
        Fra_AddClausesSuper(p,pNode,vSuper);
      }
      else {
        vSuper = (Vec_Ptr_t *)malloc(0x10);
        vSuper->nCap = 8;
        vSuper->nSize = 0;
        ppvVar5 = (void **)malloc(0x40);
        vSuper->pArray = ppvVar5;
        uVar3 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8);
        vSuper->nSize = 1;
        *ppvVar5 = (void *)(uVar3 & 0xfffffffffffffffe);
        pvVar7 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                         0xfffffffffffffffe);
        uVar1 = vSuper->nSize;
        if (0 < (long)(int)uVar1) {
          lVar6 = 0;
          do {
            if (vSuper->pArray[lVar6] == pvVar7) goto LAB_005ca858;
            lVar6 = lVar6 + 1;
          } while ((int)uVar1 != lVar6);
        }
        uVar2 = vSuper->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_005ca842;
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
            }
          }
          vSuper->pArray = ppvVar5;
          vSuper->nCap = iVar4;
        }
LAB_005ca842:
        iVar4 = vSuper->nSize;
        vSuper->nSize = iVar4 + 1;
        vSuper->pArray[iVar4] = pvVar7;
LAB_005ca858:
        pvVar7 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar1 = vSuper->nSize;
        if (0 < (long)(int)uVar1) {
          lVar6 = 0;
          do {
            if (vSuper->pArray[lVar6] == pvVar7) goto LAB_005ca906;
            lVar6 = lVar6 + 1;
          } while ((int)uVar1 != lVar6);
        }
        uVar2 = vSuper->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_005ca8f0;
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
            }
          }
          vSuper->pArray = ppvVar5;
          vSuper->nCap = iVar4;
        }
LAB_005ca8f0:
        iVar4 = vSuper->nSize;
        vSuper->nSize = iVar4 + 1;
        vSuper->pArray[iVar4] = pvVar7;
LAB_005ca906:
        pvVar7 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar1 = vSuper->nSize;
        if (0 < (long)(int)uVar1) {
          lVar6 = 0;
          do {
            if (vSuper->pArray[lVar6] == pvVar7) goto LAB_005ca9b4;
            lVar6 = lVar6 + 1;
          } while ((int)uVar1 != lVar6);
        }
        uVar2 = vSuper->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_005ca99e;
            if (vSuper->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
            }
          }
          vSuper->pArray = ppvVar5;
          vSuper->nCap = iVar4;
        }
LAB_005ca99e:
        iVar4 = vSuper->nSize;
        vSuper->nSize = iVar4 + 1;
        vSuper->pArray[iVar4] = pvVar7;
LAB_005ca9b4:
        if (0 < vSuper->nSize) {
          lVar6 = 0;
          do {
            Fra_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)vSuper->pArray[lVar6] & 0xfffffffffffffffe),vFrontier)
            ;
            lVar6 = lVar6 + 1;
          } while (lVar6 < vSuper->nSize);
        }
        Fra_AddClausesMux(p,pNode);
      }
      if (vSuper->nSize < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x113,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      *(Vec_Ptr_t **)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) = vSuper
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
    vFrontier->pArray = (void **)0x0;
  }
  free(vFrontier);
  return;
}

Assistant:

void Fra_CnfNodeAddToSolver( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Fra_ObjFaninVec(pOld)) && (!pNew || Fra_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Fra_ObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Fra_ObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Fra_ObjSatNum(pNode) );
        assert( Fra_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Fra_CollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Fra_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
}